

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::scan
               (EquivalentOptimizer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_EquivalentOptimizer_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBlock,
               currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_0090f2be:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_0090ef5b:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitIf,
               currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_0090f2be;
    }
    local_38 = pEVar1 + 2;
    local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0090ef44;
  case LoopId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitLoop,
               currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_0090f2be;
    }
    goto LAB_0090eb2c;
  case BreakId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBreak,
               currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_0090f2be;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_0090e77f;
  case SwitchId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitSwitch
               ,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_0090f2be;
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x0090e52e;
  case CallId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitCall,
               currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_0090f2be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_0090f2be;
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_0090f2be;
    }
    break;
  case LocalSetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec1a;
  case GlobalGetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_0090f2be;
    }
    break;
  case GlobalSetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090eb2c;
  case LoadId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitLoad,
               currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_0090f2be;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_0090ee95;
  case StoreId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitStore,
               currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ebe3;
  case ConstId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitConst,
               currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_0090f2be;
    }
    break;
  case UnaryId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitUnary,
               currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec1a;
  case BinaryId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBinary
               ,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee75;
  case SelectId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitSelect
               ,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e84f;
  case DropId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitDrop,
               currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case ReturnId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitReturn
               ,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e525;
  case MemorySizeId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_0090f2be;
    }
    break;
  case MemoryGrowId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case NopId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitNop,
               currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_0090f2be;
    }
    break;
  case UnreachableId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_0090f2be;
    }
    break;
  case AtomicRMWId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ecb9;
  case AtomicCmpxchgId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec9f;
  case AtomicWaitId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e3bc;
  case AtomicNotifyId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee75;
  case AtomicFenceId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_0090f2be;
    }
    break;
  case SIMDExtractId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec1a;
  case SIMDReplaceId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_0090f2be;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_0090ee80;
  case SIMDShuffleId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_0090f2be;
    }
    goto LAB_0090edf3;
  case SIMDTernaryId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e3bc;
  case SIMDShiftId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee75;
  case SIMDLoadId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ea61;
  case SIMDLoadStoreLaneId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_0090f2be;
    }
LAB_0090ebe3:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_0090ee95;
  case MemoryInitId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_0090f2be;
    }
LAB_0090ec9f:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 3));
    goto LAB_0090ecb9;
  case DataDropId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_0090f2be;
    }
    break;
  case MemoryCopyId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e84f;
  case MemoryFillId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e84f;
  case PopId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitPop,
               currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_0090f2be;
    }
    break;
  case RefNullId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_0090f2be;
    }
    break;
  case RefIsNullId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case RefFuncId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_0090f2be;
    }
    break;
  case RefEqId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitRefEq,
               currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_0090f2be;
    }
    goto LAB_0090edf3;
  case TableGetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090eb2c;
  case TableSetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ecb9;
  case TableSizeId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_0090f2be;
    }
    break;
  case TableGrowId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_0090f2be;
    }
LAB_0090ecb9:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_0090ee95;
  case TryId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitTry,
               currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_0090f2be;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_0090eb2c:
    pEVar1 = pEVar1 + 2;
    goto LAB_0090ee95;
  case ThrowId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitThrow,
               currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_0090f2be;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_0090f2be;
    }
    break;
  case TupleMakeId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_0090f2be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case I31NewId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitI31New
               ,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case I31GetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitI31Get
               ,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case CallRefId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_0090f2be;
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case RefCastId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case BrOnId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBrOn,
               currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_0090f2be;
    }
LAB_0090ea61:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0090ee95;
  case StructNewId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_0090f2be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec1a;
  case StructSetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee75;
  case ArrayNewId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_0090f2be;
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[1].type);
LAB_0090e525:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x0090e52e:
    if (lVar4 != 0) {
LAB_0090e77f:
      local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                 ::scan;
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e5cd;
  case ArrayNewFixedId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_0090f2be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0090ef5b;
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
                   LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                   ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090edf3;
  case ArraySetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_0090f2be;
    }
    goto LAB_0090e84f;
  case ArrayLenId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee4d;
  case ArrayCopyId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_0090f2be;
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 3));
    goto LAB_0090e35e;
  case ArrayFillId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_0090f2be;
    }
LAB_0090e35e:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[2].type);
    goto LAB_0090e84f;
  case ArrayInitId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_0090f2be;
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 4));
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[3].type);
LAB_0090e5cd:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0090ee95;
  case RefAsId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitRefAs,
               currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec1a;
  case StringNewId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_0090f2be;
    }
    local_38 = pEVar1 + 3;
    local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0090ef44;
  case StringConstId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_0090f2be;
    }
    break;
  case StringMeasureId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ec1a;
  case StringEncodeId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_0090f2be;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,wasm::Visitor<wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     ).
                     super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
                     .super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_0090ef44:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_0090f2be;
    }
    goto LAB_0090edf3;
  case StringEqId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_0090f2be;
    }
    goto LAB_0090ee75;
  case StringAsId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_0090f2be;
    }
LAB_0090ec1a:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0090ee95;
  case StringWTF8AdvanceId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_0090f2be;
    }
LAB_0090e84f:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)(pEVar1 + 2));
    goto LAB_0090edf3;
  case StringWTF16GetId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_0090f2be;
    }
    goto LAB_0090edf3;
  case StringIterNextId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_0090f2be;
    }
LAB_0090ee4d:
    pEVar1 = pEVar1 + 1;
LAB_0090ee95:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_0090f2be;
    }
LAB_0090ee75:
    currp_00 = pEVar1 + 2;
LAB_0090ee80:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0090ee95;
  case StringSliceWTFId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_0090f2be;
    }
LAB_0090e3bc:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_0090ee80;
  case StringSliceIterId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_0090f2be;
    }
LAB_0090edf3:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>
               ::scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0090ee95;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }